

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configparser.h
# Opt level: O0

void __thiscall phyr::ConfigArgsList::addParam<int>(ConfigArgsList *this,Param<int> *p)

{
  vector<std::shared_ptr<phyr::ParamAbstract>,_std::allocator<std::shared_ptr<phyr::ParamAbstract>_>_>
  *in_RDI;
  shared_ptr<phyr::Param<int>_> *__r;
  element_type *in_stack_ffffffffffffffd0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd8;
  
  __r = (shared_ptr<phyr::Param<int>_> *)&stack0xffffffffffffffd0;
  std::make_shared<phyr::Param<int>,int_const&,phyr::ParamType_const&>
            ((int *)in_stack_ffffffffffffffd8._M_pi,(ParamType *)in_stack_ffffffffffffffd0);
  std::shared_ptr<phyr::ParamAbstract>::shared_ptr<phyr::Param<int>,void>
            ((shared_ptr<phyr::ParamAbstract> *)in_RDI,__r);
  std::
  vector<std::shared_ptr<phyr::ParamAbstract>,_std::allocator<std::shared_ptr<phyr::ParamAbstract>_>_>
  ::push_back(in_RDI,(value_type *)__r);
  std::shared_ptr<phyr::ParamAbstract>::~shared_ptr((shared_ptr<phyr::ParamAbstract> *)0x18f050);
  std::shared_ptr<phyr::Param<int>_>::~shared_ptr((shared_ptr<phyr::Param<int>_> *)0x18f05a);
  return;
}

Assistant:

void addParam(const Param<U>& p) {
        ASSERT(idx < nArgs);
        argList.push_back(std::make_shared<Param<U>>(p.value, p.type));
    }